

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall wabt::TypeChecker::OnBrIf(TypeChecker *this,Index depth)

{
  bool bVar1;
  Result RVar2;
  TypeVector *pTVar3;
  Label *local_28;
  Label *label;
  Result result;
  Index depth_local;
  TypeChecker *this_local;
  
  label._4_4_ = depth;
  _result = this;
  label._0_4_ = PopAndCheck1Type(this,I32,"br_if");
  RVar2 = GetLabel(this,label._4_4_,&local_28);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    pTVar3 = Label::br_types(local_28);
    RVar2 = PopAndCheckSignature(this,pTVar3,"br_if");
    Result::operator|=((Result *)&label,RVar2);
    pTVar3 = Label::br_types(local_28);
    PushTypes(this,pTVar3);
    this_local._4_4_ = label._0_4_;
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::OnBrIf(Index depth) {
  Result result = PopAndCheck1Type(Type::I32, "br_if");
  Label* label;
  CHECK_RESULT(GetLabel(depth, &label));
  result |= PopAndCheckSignature(label->br_types(), "br_if");
  PushTypes(label->br_types());
  return result;
}